

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O2

void __thiscall
Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::~Array
          (Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_> *this)

{
  Array2D<Imf_3_4::FrameBuffer> *pAVar1;
  FrameBuffer *pFVar2;
  long lVar3;
  
  pAVar1 = this->_data;
  if (pAVar1 != (Array2D<Imf_3_4::FrameBuffer> *)0x0) {
    pFVar2 = pAVar1[-1]._data;
    if (pFVar2 != (FrameBuffer *)0x0) {
      lVar3 = (long)pFVar2 * 0x18;
      do {
        Array2D<Imf_3_4::FrameBuffer>::~Array2D
                  ((Array2D<Imf_3_4::FrameBuffer> *)((long)&pAVar1[-1]._sizeX + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != 0);
    }
    operator_delete__(&pAVar1[-1]._data,(long)pFVar2 * 0x18 + 8);
    return;
  }
  return;
}

Assistant:

~Array () { delete[] _data; }